

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::assignAdditionalFacet
          (DecimalDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  InvalidDatatypeFacetException *this_00;
  
  bVar2 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_TOTALDIGITS);
  if (bVar2) {
    uVar3 = XMLString::parseInt(value,manager);
    if (0 < (int)uVar3) {
      this->fTotalDigits = uVar3;
      uVar3 = 0x200;
LAB_002ef5bf:
      piVar1 = &(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                super_DatatypeValidator.fFacetsDefined;
      *piVar1 = *piVar1 | uVar3;
      return;
    }
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
               ,0x7e,FACET_PosInt_TotalDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
  }
  else {
    bVar2 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_FRACTIONDIGITS);
    if (bVar2) {
      uVar3 = XMLString::parseInt(value,manager);
      if (-1 < (int)uVar3) {
        this->fFractionDigits = uVar3;
        uVar3 = 0x400;
        goto LAB_002ef5bf;
      }
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x91,FACET_NonNeg_FractDigit,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager)
      ;
    }
    else {
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x9b,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    }
  }
  __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
}

Assistant:

void DecimalDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                   , const XMLCh* const value
                                                   , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_TOTALDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_TotalDigit, value, manager);
        }

        // check 4.3.11.c0 must: totalDigits > 0
        if ( val <= 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_PosInt_TotalDigit, value, manager);

        setTotalDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_TOTALDIGITS);
    }
    else if (XMLString::equals(key, SchemaSymbols::fgELT_FRACTIONDIGITS))
    {
        int val;
        try
        {
            val = XMLString::parseInt(value, manager);
        }
        catch (NumberFormatException&)
        {
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_FractDigit, value, manager);
        }

        // check 4.3.12.c0 must: fractionDigits > 0
        if ( val < 0 )
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_NonNeg_FractDigit, value, manager);

        setFractionDigits(val);
        setFacetsDefined(DatatypeValidator::FACET_FRACTIONDIGITS);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}